

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodes_Common.h
# Opt level: O0

void __thiscall
psy::C::AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax::
~AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax
          (AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax *this)

{
  AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax *this_local;
  
  TypeReferenceSyntax::~TypeReferenceSyntax(&this->super_TypeReferenceSyntax);
  return;
}

Assistant:

class PSY_C_API AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax final : public TypeReferenceSyntax
{
    AST_NODE_1K(AmbiguousTypeNameOrExpressionAsTypeReference, TypeReference)

public:
    const ExpressionAsTypeReferenceSyntax* expressionAsTypeReference() const { return exprAsTyRef_; }
    const TypeNameAsTypeReferenceSyntax* typeNameAsTypeReference() const { return tyNameAsTyRef_; }

private:
    ExpressionAsTypeReferenceSyntax* exprAsTyRef_ = nullptr;
    TypeNameAsTypeReferenceSyntax* tyNameAsTyRef_ = nullptr;
    AST_CHILD_LST2(exprAsTyRef_, tyNameAsTyRef_);
}